

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
          (sysbvm_context_t *context,sysbvm_tuple_t node)

{
  uint32_t *puVar1;
  _Bool _Var2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *psVar5;
  ulong uVar6;
  sysbvm_metatype_t *metatype;
  sysbvm_tuple_t *tuple;
  sysbvm_tuple_t *local_38;
  sysbvm_tuple_t local_30;
  
  _Var2 = sysbvm_astNode_isLiteralNode(context,node);
  if (_Var2) {
    sVar4 = sysbvm_astLiteralNode_getValue(node);
    return sVar4;
  }
  if ((node & 0xf) == 0 && node != 0) {
    tuple = *(sysbvm_tuple_t **)(node + 0x20);
  }
  else {
    tuple = (sysbvm_tuple_t *)0x0;
  }
  uVar6 = (ulong)tuple & 0xf;
  if (uVar6 != 0 || tuple == (sysbvm_tuple_t *)0x0) {
    if ((int)uVar6 == 0xf) {
      sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)tuple >> 4);
    }
    else {
      sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
    }
  }
  else {
    sVar4 = *tuple;
  }
  sVar4 = sysbvm_type_lookupSelector
                    (context,sVar4,
                     (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
  local_30 = node;
  if (sVar4 == 0) {
    if ((uVar6 != 0 || tuple == (sysbvm_tuple_t *)0x0) || ((tuple[1] & 0x80) != 0)) {
      uVar3 = 0;
    }
    else {
      uVar6 = tuple[0xe];
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar3 = (uint)((long)uVar6 >> 4);
      }
      else {
        uVar3 = (uint)*(undefined8 *)(uVar6 + 0x10);
      }
    }
    if ((uVar3 >> 10 & 1) != 0) {
      tuple = (sysbvm_tuple_t *)tuple[0x1f];
      uVar6 = (ulong)tuple & 0xf;
      if (uVar6 == 0 && tuple != (sysbvm_tuple_t *)0x0) {
        sVar4 = *tuple;
      }
      else if ((int)uVar6 == 0xf) {
        sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)tuple >> 4);
      }
      else {
        sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
      }
      sVar4 = sysbvm_type_lookupSelector
                        (context,sVar4,
                         (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
      if (sVar4 != 0) {
        local_38 = tuple;
        sVar4 = sysbvm_function_apply(context,sVar4,2,(sysbvm_tuple_t *)&local_38,0);
        return sVar4;
      }
    }
    _Var2 = sysbvm_tuple_isKindOf(context,(sysbvm_tuple_t)tuple,(context->roots).metatypeType);
    if (((!_Var2) ||
        (psVar5 = (sysbvm_object_tuple_t *)tuple[0x1f], psVar5 == (sysbvm_object_tuple_t *)0x0)) &&
       (psVar5 = sysbvm_context_allocatePointerTuple(context,(sysbvm_tuple_t)tuple,0),
       ((ulong)psVar5 & 0xf) == 0 && psVar5 != (sysbvm_object_tuple_t *)0x0)) {
      puVar1 = &(psVar5->header).identityHashAndFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  else {
    local_38 = tuple;
    psVar5 = (sysbvm_object_tuple_t *)
             sysbvm_function_apply(context,sVar4,2,(sysbvm_tuple_t *)&local_38,0);
  }
  return (sysbvm_tuple_t)psVar5;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(sysbvm_context_t *context, sysbvm_tuple_t node)
{
    // Unwrap the literal values.
    if(sysbvm_astNode_isLiteralNode(context, node))
        return sysbvm_astLiteralNode_getValue(node);

    // Get the analyzed type of the node.
    sysbvm_tuple_t analyzedType = sysbvm_astNode_getAnalyzedType(node);

    // Find a method.
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
    if(method)
        return sysbvm_function_apply2(context, method, analyzedType, node);

    // Use the base type in the case of reference types.
    if(sysbvm_type_isReferenceType(analyzedType))
    {
        analyzedType = ((sysbvm_referenceType_t*)analyzedType)->super.baseType;
        sysbvm_tuple_t baseTypeMethod = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
        if(baseTypeMethod)
            return sysbvm_function_apply2(context, baseTypeMethod, analyzedType, node);
    }

    // If the node is a subtype of metatype, and this type is defined then return the type.
    if(sysbvm_tuple_isKindOf(context, analyzedType, context->roots.metatypeType))
    {
        sysbvm_metatype_t *metatype = (sysbvm_metatype_t*)analyzedType;
        if(metatype->thisType)
            return metatype->thisType;
    }

    // Construct a dummy value that has the same type
    sysbvm_tuple_t dummyValue = (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, analyzedType, 0);
    sysbvm_tuple_markDummyValue(dummyValue);
    return dummyValue;
}